

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WjTestLib.c
# Opt level: O2

void WjTestLib_NewGroup(char *GroupName)

{
  WjtlGroupList *pWVar1;
  char *pcVar2;
  WjtlGroupList **ppWVar3;
  
  pWVar1 = (WjtlGroupList *)calloc(1,0x28);
  if (pWVar1 != (WjtlGroupList *)0x0) {
    pcVar2 = strdup(GroupName);
    pWVar1->GroupName = pcVar2;
    if (pcVar2 != (char *)0x0) {
      ppWVar3 = &gGroupListHead;
      if (gGroupListTail != (WjtlGroupList *)0x0) {
        ppWVar3 = &gGroupListTail->Next;
      }
      ((WjtlGroupList *)ppWVar3)->Next = pWVar1;
      gGroupListTail = pWVar1;
      return;
    }
  }
  InternalError("Memory Fail");
  return;
}

Assistant:

void
WjTestLib_NewGroup
    (
        char const*     GroupName
    )
{
    WjtlGroupList* newGroup = calloc( 1, sizeof(WjtlGroupList) );
    if( NULL != newGroup )
    {
        newGroup->GroupName = strdup( GroupName );
        if( NULL != newGroup->GroupName )
        {
            newGroup->Next = NULL;
            newGroup->TestListHead = NULL;
            newGroup->TestListTail = NULL;

            if( NULL != gGroupListTail )
            {
                gGroupListTail->Next = newGroup;
            }
            else
            {
                gGroupListHead = newGroup;
            }
            gGroupListTail = newGroup;
        }
        else
        {
            InternalError( "Memory Fail" );
        }
    }
    else
    {
        InternalError( "Memory Fail" );
    }
}